

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ExternalCommand::configureOutputs
          (ExternalCommand *this,ConfigureContext *param_1,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  bool bVar1;
  size_type __n;
  reference ppNVar2;
  BuildNode *local_48;
  BuildNode *local_40;
  Node *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *__range1;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value_local;
  ConfigureContext *param_1_local;
  ExternalCommand *this_local;
  
  __n = std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
        size(value);
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::reserve(&(this->super_Command).outputs,__n);
  __end1 = std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
           ::begin(value);
  node = (Node *)std::
                 vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                 ::end(value);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
                                *)&node);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
              ::operator*(&__end1);
    local_48 = (BuildNode *)*ppNVar2;
    local_40 = local_48;
    std::vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>::
    emplace_back<llbuild::buildsystem::BuildNode*>
              ((vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>
                *)&(this->super_Command).outputs,&local_48);
    __gnu_cxx::
    __normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ExternalCommand::
configureOutputs(const ConfigureContext&, const std::vector<Node*>& value) {
  outputs.reserve(value.size());
  for (auto* node: value) {
    outputs.emplace_back(static_cast<BuildNode*>(node));
  }
}